

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::RenderTestThread>::SharedPtr
          (SharedPtr<deqp::egl::RenderTestThread> *this,RenderTestThread *ptr)

{
  RenderTestThread *pRVar1;
  SharedPtrState<deqp::egl::RenderTestThread,_de::DefaultDeleter<deqp::egl::RenderTestThread>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::RenderTestThread> local_25 [13];
  RenderTestThread *local_18;
  RenderTestThread *ptr_local;
  SharedPtr<deqp::egl::RenderTestThread> *this_local;
  
  this->m_ptr = (RenderTestThread *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (RenderTestThread *)this;
  pSVar2 = (SharedPtrState<deqp::egl::RenderTestThread,_de::DefaultDeleter<deqp::egl::RenderTestThread>_>
            *)operator_new(0x20);
  pRVar1 = local_18;
  DefaultDeleter<deqp::egl::RenderTestThread>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::RenderTestThread,_de::DefaultDeleter<deqp::egl::RenderTestThread>_>::
  SharedPtrState(pSVar2,pRVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}